

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
::operator()(gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
             *this,double *blockB,const_blas_data_mapper<double,_long,_0> *rhs,long depth,long cols,
            long stride,long offset)

{
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  long local_260;
  long k_1;
  LinearMapper dm0_1;
  long j2_1;
  long k;
  LinearMapper dm3;
  LinearMapper dm2;
  LinearMapper dm1;
  LinearMapper dm0;
  long j2;
  long peeled_k;
  long count;
  long packet_cols4;
  long packet_cols8;
  long lStack_1f0;
  conj_if<false> cj;
  long stride_local;
  long cols_local;
  long depth_local;
  const_blas_data_mapper<double,_long,_0> *rhs_local;
  double *blockB_local;
  gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
  *this_local;
  undefined1 local_1a8 [8];
  double *local_1a0;
  undefined8 local_198;
  const_blas_data_mapper<double,_long,_0> *local_190;
  long local_188;
  undefined8 local_180;
  const_blas_data_mapper<double,_long,_0> *local_178;
  undefined1 local_170 [8];
  long local_168;
  undefined8 local_160;
  const_blas_data_mapper<double,_long,_0> *local_158;
  long local_150;
  undefined8 local_148;
  const_blas_data_mapper<double,_long,_0> *local_140;
  undefined1 local_138 [8];
  long local_130;
  undefined8 local_128;
  const_blas_data_mapper<double,_long,_0> *local_120;
  long local_118;
  undefined8 local_110;
  const_blas_data_mapper<double,_long,_0> *local_108;
  undefined1 local_100 [8];
  long local_f8;
  undefined8 local_f0;
  const_blas_data_mapper<double,_long,_0> *local_e8;
  double *local_e0;
  undefined8 local_d8;
  const_blas_data_mapper<double,_long,_0> *local_d0;
  undefined1 local_c8 [8];
  double *local_c0;
  undefined8 local_b8;
  const_blas_data_mapper<double,_long,_0> *local_b0;
  long local_a8;
  long *local_a0;
  long local_98;
  long *local_90;
  long local_88;
  LinearMapper *local_80;
  long local_78;
  LinearMapper *local_70;
  long local_68;
  LinearMapper *local_60;
  double *local_58;
  undefined1 *local_50;
  double *local_48;
  undefined1 *local_40;
  double *local_38;
  undefined1 *local_30;
  double *local_28;
  undefined1 *local_20;
  double *local_18;
  undefined1 *local_10;
  
  lStack_1f0 = stride;
  ignore_unused_variable<long>(&stack0xfffffffffffffe10);
  ignore_unused_variable<long>(&offset);
  if ((lStack_1f0 != 0) || (bVar1 = true, offset != 0)) {
    bVar1 = false;
  }
  if (bVar1) {
    pdVar2 = (double *)(cols / 4 << 2);
    peeled_k = 0;
    for (dm0.m_data = (double *)0x0; dm0_1.m_data = pdVar2, (long)dm0.m_data < (long)pdVar2;
        dm0.m_data = dm0.m_data + 4) {
      local_d8 = 0;
      local_e0 = dm0.m_data;
      local_b8 = 0;
      local_c0 = dm0.m_data;
      dm1.m_data = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                   (long)dm0.m_data *
                   (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
      local_50 = local_c8;
      local_118 = (long)dm0.m_data + 1;
      local_110 = 0;
      local_f0 = 0;
      dm2.m_data = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                   local_118 * (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
      local_40 = local_100;
      local_150 = (long)dm0.m_data + 2;
      local_148 = 0;
      local_128 = 0;
      dm3.m_data = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                   local_150 * (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
      local_30 = local_138;
      local_188 = (long)dm0.m_data + 3;
      local_180 = 0;
      local_160 = 0;
      k = (long)((rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                local_188 * (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride);
      local_20 = local_170;
      local_178 = rhs;
      local_168 = local_188;
      local_158 = rhs;
      local_140 = rhs;
      local_130 = local_150;
      local_120 = rhs;
      local_108 = rhs;
      local_f8 = local_118;
      local_e8 = rhs;
      local_d0 = rhs;
      local_b0 = rhs;
      local_58 = dm1.m_data;
      local_48 = dm2.m_data;
      local_38 = dm3.m_data;
      local_28 = (double *)k;
      for (j2_1 = 0; j2_1 < depth; j2_1 = j2_1 + 1) {
        local_60 = &dm1;
        local_68 = j2_1;
        pdVar3 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),dm1.m_data + j2_1);
        blockB[peeled_k] = *pdVar3;
        local_70 = &dm2;
        local_78 = j2_1;
        pdVar3 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),dm2.m_data + j2_1);
        blockB[peeled_k + 1] = *pdVar3;
        local_80 = &dm3;
        local_88 = j2_1;
        pdVar3 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),dm3.m_data + j2_1);
        blockB[peeled_k + 2] = *pdVar3;
        local_90 = &k;
        local_98 = j2_1;
        pdVar3 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),(double *)(k + j2_1 * 8));
        blockB[peeled_k + 3] = *pdVar3;
        peeled_k = peeled_k + 4;
      }
    }
    for (; (long)dm0_1.m_data < cols; dm0_1.m_data = dm0_1.m_data + 1) {
      local_198 = 0;
      local_1a0 = dm0_1.m_data;
      k_1 = (long)((rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                  (long)dm0_1.m_data *
                  (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride);
      local_10 = local_1a8;
      local_190 = rhs;
      local_18 = (double *)k_1;
      for (local_260 = 0; local_260 < depth; local_260 = local_260 + 1) {
        local_a0 = &k_1;
        local_a8 = local_260;
        pdVar2 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),
                            (double *)(k_1 + local_260 * 8));
        blockB[peeled_k] = *pdVar2;
        peeled_k = peeled_k + 1;
      }
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/CoolProp/externals/Eigen/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x772,
                "void Eigen::internal::gemm_pack_rhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 0>, 4, 0>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 0>, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = false]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;
  const Index peeled_k = (depth/PacketSize)*PacketSize;
//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       const Scalar* b0 = &rhs[(j2+0)*rhsStride];
//       const Scalar* b1 = &rhs[(j2+1)*rhsStride];
//       const Scalar* b2 = &rhs[(j2+2)*rhsStride];
//       const Scalar* b3 = &rhs[(j2+3)*rhsStride];
//       const Scalar* b4 = &rhs[(j2+4)*rhsStride];
//       const Scalar* b5 = &rhs[(j2+5)*rhsStride];
//       const Scalar* b6 = &rhs[(j2+6)*rhsStride];
//       const Scalar* b7 = &rhs[(j2+7)*rhsStride];
//       Index k=0;
//       if(PacketSize==8) // TODO enbale vectorized transposition for PacketSize==4
//       {
//         for(; k<peeled_k; k+=PacketSize) {
//           PacketBlock<Packet> kernel;
//           for (int p = 0; p < PacketSize; ++p) {
//             kernel.packet[p] = ploadu<Packet>(&rhs[(j2+p)*rhsStride+k]);
//           }
//           ptranspose(kernel);
//           for (int p = 0; p < PacketSize; ++p) {
//             pstoreu(blockB+count, cj.pconj(kernel.packet[p]));
//             count+=PacketSize;
//           }
//         }
//       }
//       for(; k<depth; k++)
//       {
//         blockB[count+0] = cj(b0[k]);
//         blockB[count+1] = cj(b1[k]);
//         blockB[count+2] = cj(b2[k]);
//         blockB[count+3] = cj(b3[k]);
//         blockB[count+4] = cj(b4[k]);
//         blockB[count+5] = cj(b5[k]);
//         blockB[count+6] = cj(b6[k]);
//         blockB[count+7] = cj(b7[k]);
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }

  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      const LinearMapper dm0 = rhs.getLinearMapper(0, j2 + 0);
      const LinearMapper dm1 = rhs.getLinearMapper(0, j2 + 1);
      const LinearMapper dm2 = rhs.getLinearMapper(0, j2 + 2);
      const LinearMapper dm3 = rhs.getLinearMapper(0, j2 + 3);

      Index k=0;
      if((PacketSize%4)==0) // TODO enable vectorized transposition for PacketSize==2 ??
      {
        for(; k<peeled_k; k+=PacketSize) {
          PacketBlock<Packet,(PacketSize%4)==0?4:PacketSize> kernel;
          kernel.packet[0] = dm0.loadPacket(k);
          kernel.packet[1%PacketSize] = dm1.loadPacket(k);
          kernel.packet[2%PacketSize] = dm2.loadPacket(k);
          kernel.packet[3%PacketSize] = dm3.loadPacket(k);
          ptranspose(kernel);
          pstoreu(blockB+count+0*PacketSize, cj.pconj(kernel.packet[0]));
          pstoreu(blockB+count+1*PacketSize, cj.pconj(kernel.packet[1%PacketSize]));
          pstoreu(blockB+count+2*PacketSize, cj.pconj(kernel.packet[2%PacketSize]));
          pstoreu(blockB+count+3*PacketSize, cj.pconj(kernel.packet[3%PacketSize]));
          count+=4*PacketSize;
        }
      }
      for(; k<depth; k++)
      {
        blockB[count+0] = cj(dm0(k));
        blockB[count+1] = cj(dm1(k));
        blockB[count+2] = cj(dm2(k));
        blockB[count+3] = cj(dm3(k));
        count += 4;
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const LinearMapper dm0 = rhs.getLinearMapper(0, j2);
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(dm0(k));
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}